

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

fixed_measurement __thiscall units::root(units *this,fixed_measurement *fm,int power)

{
  unit uVar1;
  fixed_measurement fVar2;
  unit local_20;
  
  fVar2.value_ = numericalRoot<double>(fm->value_,power);
  local_20 = fm->units_;
  uVar1 = root(&local_20,power);
  *(double *)this = fVar2.value_;
  *(unit *)(this + 8) = uVar1;
  fVar2.units_ = (unit)this;
  return fVar2;
}

Assistant:

fixed_measurement root(const fixed_measurement& fm, int power)
{
    return {numericalRoot(fm.value(), power), root(fm.units(), power)};
}